

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmModuleGenerator::GenerateFunctionHeader(WasmModuleGenerator *this,uint32 index)

{
  undefined8 uVar1;
  Utf8SourceInfo *this_00;
  ScriptContext *scriptContext;
  AsmJsFunctionInfo *pAVar2;
  uint uVar3;
  uint displayNameLength;
  char16 *displayName;
  AsmJsVarType type_00;
  ArgSlot AVar4;
  uint32 uVar5;
  uint uVar6;
  Type TVar7;
  uint32 uVar8;
  Local wasmType;
  AsmJsRetType val;
  WasmCompilationException *pWVar9;
  size_t sizeInWords;
  Recycler *pRVar10;
  char16_t *pcVar11;
  SRCINFO *this_01;
  SourceContextInfo *pSVar12;
  WasmReaderInfo *this_02;
  WasmSignature *pWVar13;
  unsigned_short *puVar14;
  Which *val_00;
  WasmType local_2a4;
  WasmType returnType;
  ArgSlot local_19a;
  WasmType type;
  ArgSlot i;
  TrackAllocData local_188;
  code *local_160;
  undefined8 local_158;
  TrackAllocData local_150;
  uint *local_128;
  uint32 *argSizeArray;
  ArgSlot argSizeLength;
  AsmJsFunctionInfo *pAStack_118;
  ArgSlot paramCount;
  AsmJsFunctionInfo *info;
  undefined8 local_108;
  TrackAllocData local_100;
  WasmReaderInfo *local_d8;
  WasmReaderInfo *readerInfo;
  FunctionBody *body;
  undefined8 local_c0;
  TrackAllocData local_b8;
  char16_t *local_90;
  char16 *autoName_1;
  undefined8 local_80;
  TrackAllocData local_78;
  char16 *local_50;
  char16 *autoName;
  WasmExport *wasmExport;
  uint32 iExport;
  int nameLength;
  char16 *functionName;
  WasmFunctionInfo *local_20;
  WasmFunctionInfo *wasmInfo;
  WasmModuleGenerator *pWStack_10;
  uint32 index_local;
  WasmModuleGenerator *this_local;
  
  wasmInfo._4_4_ = index;
  pWStack_10 = this;
  local_20 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
  if (local_20 == (WasmFunctionInfo *)0x0) {
    pWVar9 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (pWVar9,L"Invalid function index %u",(ulong)wasmInfo._4_4_);
    __cxa_throw(pWVar9,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  _iExport = (char16 *)0x0;
  wasmExport._4_4_ = 0;
  uVar5 = WasmFunctionInfo::GetNameLength(local_20);
  if (uVar5 == 0) {
    for (wasmExport._0_4_ = 0; uVar3 = (uint)wasmExport,
        uVar6 = Js::WebAssemblyModule::GetExportCount(this->m_module), uVar3 < uVar6;
        wasmExport._0_4_ = (uint)wasmExport + 1) {
      autoName = (char16 *)Js::WebAssemblyModule::GetExport(this->m_module,(uint)wasmExport);
      if (((((WasmExport *)autoName != (WasmExport *)0x0) &&
           (((WasmExport *)autoName)->kind == Function)) &&
          (((WasmExport *)autoName)->nameLength != 0)) &&
         ((TVar7 = Js::WebAssemblyModule::GetFunctionIndexType
                             (this->m_module,((WasmExport *)autoName)->index), TVar7 == Function &&
          (uVar5 = *(uint32 *)autoName, uVar8 = WasmFunctionInfo::GetNumber(local_20),
          uVar5 == uVar8)))) {
        wasmExport._4_4_ = *(int *)(autoName + 2) + 0x10;
        pRVar10 = this->m_recycler;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_78,(type_info *)&char16_t::typeinfo,0,(long)(int)wasmExport._4_4_,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                   ,0x187);
        pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_78);
        autoName_1 = (char16 *)Memory::Recycler::AllocLeafZero;
        local_80 = 0;
        pcVar11 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                            ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                             (long)(int)wasmExport._4_4_);
        sizeInWords = (size_t)(int)wasmExport._4_4_;
        uVar1 = *(undefined8 *)(autoName + 4);
        local_50 = pcVar11;
        uVar5 = WasmFunctionInfo::GetNumber(local_20);
        wasmExport._4_4_ =
             swprintf_s((char16_t_conflict *)pcVar11,sizeInWords,(char16_t_conflict *)L"%s[%u]",
                        uVar1,(ulong)uVar5);
        _iExport = local_50;
        break;
      }
    }
  }
  else {
    _iExport = WasmFunctionInfo::GetName(local_20);
    wasmExport._4_4_ = WasmFunctionInfo::GetNameLength(local_20);
  }
  if (_iExport == (char16 *)0x0) {
    pRVar10 = this->m_recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b8,(type_info *)&char16_t::typeinfo,0,0x20,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
               ,0x191);
    pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_b8);
    body = (FunctionBody *)Memory::Recycler::AllocLeafZero;
    local_c0 = 0;
    pcVar11 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                        ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeafZero,0,0x20);
    local_90 = pcVar11;
    uVar5 = WasmFunctionInfo::GetNumber(local_20);
    wasmExport._4_4_ =
         swprintf_s((char16_t_conflict *)pcVar11,0x20,(char16_t_conflict *)L"wasm-function[%u]",
                    (ulong)uVar5);
    _iExport = local_90;
  }
  displayName = _iExport;
  displayNameLength = wasmExport._4_4_;
  this_00 = this->m_sourceInfo;
  scriptContext = this->m_scriptContext;
  this_01 = Js::Utf8SourceInfo::GetSrcInfo(this_00);
  pSVar12 = Memory::WriteBarrierPtr<SourceContextInfo>::operator->(&this_01->sourceContextInfo);
  uVar6 = pSVar12->sourceContextId;
  uVar5 = WasmFunctionInfo::GetNumber(local_20);
  readerInfo = (WasmReaderInfo *)
               Js::FunctionBody::NewFromRecycler
                         (scriptContext,displayName,displayNameLength,0,0,this_00,uVar6,uVar5,
                          ErrorOnNew,Flags_None);
  WasmFunctionInfo::SetBody(local_20,(FunctionBody *)readerInfo);
  Js::ParseableFunctionInfo::SetSourceInfo((ParseableFunctionInfo *)readerInfo,0);
  Js::FunctionBody::AllocateAsmJsFunctionInfo((FunctionBody *)readerInfo);
  Js::FunctionBody::SetIsAsmJsFunction((FunctionBody *)readerInfo,true);
  Js::ParseableFunctionInfo::SetIsAsmjsMode((ParseableFunctionInfo *)readerInfo,true);
  Js::ParseableFunctionInfo::SetIsWasmFunction((ParseableFunctionInfo *)readerInfo,true);
  pRVar10 = this->m_recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_100,(type_info *)&WasmReaderInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x1ad);
  pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_100);
  info = (AsmJsFunctionInfo *)Memory::Recycler::AllocInlined;
  local_108 = 0;
  this_02 = (WasmReaderInfo *)new<Memory::Recycler>(0x10,pRVar10,0x43c4b0);
  (this_02->m_funcInfo).ptr = (WasmFunctionInfo *)0x0;
  (this_02->m_module).ptr = (WebAssemblyModule *)0x0;
  WasmReaderInfo::WasmReaderInfo(this_02);
  local_d8 = this_02;
  Memory::WriteBarrierPtr<Wasm::WasmFunctionInfo>::operator=
            ((WriteBarrierPtr<Wasm::WasmFunctionInfo> *)this_02,local_20);
  Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator=(&local_d8->m_module,this->m_module);
  Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint((FunctionBody *)readerInfo);
  pAStack_118 = Js::FunctionBody::GetAsmJsFunctionInfo((FunctionBody *)readerInfo);
  Js::AsmJsFunctionInfo::SetWasmReaderInfo(pAStack_118,local_d8);
  Js::AsmJsFunctionInfo::SetWebAssemblyModule(pAStack_118,this->m_module);
  argSizeArray._6_2_ = WasmFunctionInfo::GetParamCount(local_20);
  Js::AsmJsFunctionInfo::SetArgCount(pAStack_118,argSizeArray._6_2_);
  pAVar2 = pAStack_118;
  pWVar13 = WasmFunctionInfo::GetSignature(local_20);
  Js::AsmJsFunctionInfo::SetWasmSignature(pAVar2,pWVar13);
  argSizeArray._2_2_ = 3;
  puVar14 = max<unsigned_short>((unsigned_short *)((long)&argSizeArray + 6),
                                (unsigned_short *)((long)&argSizeArray + 2));
  argSizeArray._4_2_ = *puVar14;
  Js::AsmJsFunctionInfo::SetArgSizeArrayLength(pAStack_118,argSizeArray._4_2_);
  pRVar10 = this->m_recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_150,(type_info *)&unsigned_int::typeinfo,0,(ulong)argSizeArray._4_2_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x1bc);
  pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_150);
  local_160 = Memory::Recycler::AllocLeafZero;
  local_158 = 0;
  local_128 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                        ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                         (ulong)argSizeArray._4_2_);
  Js::AsmJsFunctionInfo::SetArgsSizesArray(pAStack_118,local_128);
  if (argSizeArray._6_2_ == 0) {
    Js::ParseableFunctionInfo::SetHasImplicitArgIns((ParseableFunctionInfo *)readerInfo,false);
  }
  else {
    Js::ParseableFunctionInfo::SetInParamsCount
              ((ParseableFunctionInfo *)readerInfo,argSizeArray._6_2_ + 1);
    Js::ParseableFunctionInfo::SetReportedInParamsCount
              ((ParseableFunctionInfo *)readerInfo,argSizeArray._6_2_ + 1);
    pAVar2 = pAStack_118;
    pRVar10 = this->m_recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_188,(type_info *)&Js::AsmJsVarType::Which::typeinfo,0,
               (ulong)argSizeArray._6_2_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
               ,0x1c4);
    pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_188);
    val_00 = Memory::AllocateArray<Memory::Recycler,Js::AsmJsVarType::Which,false>
                       ((Memory *)pRVar10,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)argSizeArray._6_2_);
    Js::AsmJsFunctionInfo::SetArgTypeArray(pAVar2,val_00);
  }
  for (local_19a = 0; pAVar2 = pAStack_118, local_19a < argSizeArray._6_2_;
      local_19a = local_19a + 1) {
    pWVar13 = WasmFunctionInfo::GetSignature(local_20);
    wasmType = WasmSignature::GetParam(pWVar13,local_19a);
    pAVar2 = pAStack_118;
    type_00 = WasmToAsmJs::GetAsmJsVarType(wasmType);
    Js::AsmJsFunctionInfo::SetArgType(pAVar2,type_00,local_19a);
    pWVar13 = WasmFunctionInfo::GetSignature(local_20);
    AVar4 = WasmSignature::GetParamSize(pWVar13,local_19a);
    local_128[local_19a] = (uint)AVar4;
  }
  pWVar13 = WasmFunctionInfo::GetSignature(local_20);
  AVar4 = WasmSignature::GetParamsSize(pWVar13);
  Js::AsmJsFunctionInfo::SetArgByteSize(pAVar2,AVar4);
  pWVar13 = WasmFunctionInfo::GetSignature(local_20);
  uVar5 = WasmSignature::GetResultCount(pWVar13);
  if (1 < uVar5) {
    pWVar9 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar9,L"Multi return values not supported");
    __cxa_throw(pWVar9,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar13 = WasmFunctionInfo::GetSignature(local_20);
  uVar5 = WasmSignature::GetResultCount(pWVar13);
  if (uVar5 == 1) {
    pWVar13 = WasmFunctionInfo::GetSignature(local_20);
    local_2a4 = WasmSignature::GetResult(pWVar13,0);
  }
  else {
    local_2a4 = Void;
  }
  pAVar2 = pAStack_118;
  val = WasmToAsmJs::GetAsmJsReturnType(local_2a4);
  Js::AsmJsFunctionInfo::SetReturnType(pAVar2,val);
  return;
}

Assistant:

void WasmModuleGenerator::GenerateFunctionHeader(uint32 index)
{
    WasmFunctionInfo* wasmInfo = m_module->GetWasmFunctionInfo(index);
    if (!wasmInfo)
    {
        throw WasmCompilationException(_u("Invalid function index %u"), index);
    }

    const char16* functionName = nullptr;
    int nameLength = 0;

    if (wasmInfo->GetNameLength() > 0)
    {
        functionName = wasmInfo->GetName();
        nameLength = wasmInfo->GetNameLength();
    }
    else
    {
        for (uint32 iExport = 0; iExport < m_module->GetExportCount(); ++iExport)
        {
            Wasm::WasmExport* wasmExport = m_module->GetExport(iExport);
            if (wasmExport  &&
                wasmExport->kind == ExternalKinds::Function &&
                wasmExport->nameLength > 0 &&
                m_module->GetFunctionIndexType(wasmExport->index) == FunctionIndexTypes::Function &&
                wasmExport->index == wasmInfo->GetNumber())
            {
                nameLength = wasmExport->nameLength + 16;
                char16 * autoName = RecyclerNewArrayLeafZ(m_recycler, char16, nameLength);
                nameLength = swprintf_s(autoName, nameLength, _u("%s[%u]"), wasmExport->name, wasmInfo->GetNumber());
                functionName = autoName;
                break;
            }
        }
    }

    if (!functionName)
    {
        char16* autoName = RecyclerNewArrayLeafZ(m_recycler, char16, 32);
        nameLength = swprintf_s(autoName, 32, _u("wasm-function[%u]"), wasmInfo->GetNumber());
        functionName = autoName;
    }

    Js::FunctionBody* body = Js::FunctionBody::NewFromRecycler(
        m_scriptContext,
        functionName,
        nameLength,
        0,
        0,
        m_sourceInfo,
        m_sourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId,
        wasmInfo->GetNumber(),
        Js::FunctionInfo::Attributes::ErrorOnNew,
        Js::FunctionBody::Flags_None
#ifdef PERF_COUNTERS
        , false /* is function from deferred deserialized proxy */
#endif
    );
    wasmInfo->SetBody(body);
    // TODO (michhol): numbering
    body->SetSourceInfo(0);
    body->AllocateAsmJsFunctionInfo();
    body->SetIsAsmJsFunction(true);
    body->SetIsAsmjsMode(true);
    body->SetIsWasmFunction(true);

    WasmReaderInfo* readerInfo = RecyclerNew(m_recycler, WasmReaderInfo);
    readerInfo->m_funcInfo = wasmInfo;
    readerInfo->m_module = m_module;

    Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(body);

    Js::AsmJsFunctionInfo* info = body->GetAsmJsFunctionInfo();
    info->SetWasmReaderInfo(readerInfo);
    info->SetWebAssemblyModule(m_module);

    Js::ArgSlot paramCount = wasmInfo->GetParamCount();
    info->SetArgCount(paramCount);
    info->SetWasmSignature(wasmInfo->GetSignature());
    Js::ArgSlot argSizeLength = max(paramCount, 3ui16);
    info->SetArgSizeArrayLength(argSizeLength);
    uint32* argSizeArray = RecyclerNewArrayLeafZ(m_recycler, uint32, argSizeLength);
    info->SetArgsSizesArray(argSizeArray);

    if (paramCount > 0)
    {
        // +1 here because asm.js includes the this pointer
        body->SetInParamsCount(paramCount + 1);
        body->SetReportedInParamsCount(paramCount + 1);
        info->SetArgTypeArray(RecyclerNewArrayLeaf(m_recycler, Js::AsmJsVarType::Which, paramCount));
    }
    else
    {
        // overwrite default value in this case
        body->SetHasImplicitArgIns(false);
    }
    for (Js::ArgSlot i = 0; i < paramCount; ++i)
    {
        WasmTypes::WasmType type = wasmInfo->GetSignature()->GetParam(i);
        info->SetArgType(WasmToAsmJs::GetAsmJsVarType(type), i);
        argSizeArray[i] = wasmInfo->GetSignature()->GetParamSize(i);
    }
    info->SetArgByteSize(wasmInfo->GetSignature()->GetParamsSize());
    if (wasmInfo->GetSignature()->GetResultCount() <= 1)
    {
        WasmTypes::WasmType returnType = wasmInfo->GetSignature()->GetResultCount() == 1 ? wasmInfo->GetSignature()->GetResult(0) : WasmTypes::Void;
        info->SetReturnType(WasmToAsmJs::GetAsmJsReturnType(returnType));
    }
    else
    {
        throw WasmCompilationException(_u("Multi return values not supported"));
    }
}